

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O0

void z_sqrt(complex *r,complex *z)

{
  float fVar1;
  double dVar2;
  float mag;
  complex *z_local;
  complex *r_local;
  
  fVar1 = f__cabs(z->r,z->i);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (z->r <= 0.0) {
      dVar2 = sqrt((double)(fVar1 - z->r) * 0.5);
      r->i = (float)dVar2;
      if (z->i <= 0.0 && z->i != 0.0) {
        r->i = -r->i;
      }
      r->r = (z->i / r->i) / 2.0;
    }
    else {
      dVar2 = sqrt((double)(fVar1 + z->r) * 0.5);
      r->r = (float)dVar2;
      r->i = (z->i / r->r) / 2.0;
    }
  }
  else {
    r->i = 0.0;
    r->r = 0.0;
  }
  return;
}

Assistant:

void
z_sqrt(complex * r, complex * z)
#endif
{
    float mag;

    if ((mag = f__cabs(z->r, z->i)) == 0.)
        r->r = r->i = 0.;
    else if (z->r > 0) {
        r->r = sqrt(0.5 * (mag + z->r));
        r->i = z->i / r->r / 2;
    }
    else {
        r->i = sqrt(0.5 * (mag - z->r));
        if (z->i < 0)
            r->i = -r->i;
        r->r = z->i / r->i / 2;
    }
}